

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O2

void psh_hint_table_activate_mask(PSH_Hint_Table table,PS_Mask hint_mask)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  PSH_Hint_conflict pPVar4;
  PSH_Hint_conflict *ppPVar5;
  byte *pbVar6;
  FT_UInt *pFVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  
  pbVar6 = hint_mask->bytes;
  uVar1 = hint_mask->num_bits;
  uVar2 = table->max_hints;
  pFVar7 = &table->hints->flags;
  uVar9 = uVar2;
  while (bVar14 = uVar9 != 0, uVar9 = uVar9 - 1, bVar14) {
    *(byte *)pFVar7 = (byte)*pFVar7 & 0xfb;
    pFVar7[4] = -1;
    pFVar7 = pFVar7 + 0xc;
  }
  uVar9 = 0;
  uVar11 = 0;
  uVar12 = 0;
  for (lVar10 = 0; (ulong)uVar1 * 0x30 - lVar10 != 0; lVar10 = lVar10 + 0x30) {
    if (uVar12 == 0) {
      uVar11 = (uint)*pbVar6;
      pbVar6 = pbVar6 + 1;
      uVar12 = 0x80;
    }
    if ((uVar12 & uVar11) != 0) {
      pPVar4 = table->hints;
      uVar3 = *(uint *)((long)&pPVar4->flags + lVar10);
      if (((uVar3 & 4) == 0) &&
         (*(uint *)((long)&pPVar4->flags + lVar10) = uVar3 | 4, uVar9 < uVar2)) {
        uVar13 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
        table->sort[uVar13] = (PSH_Hint_conflict)((long)&pPVar4->org_pos + lVar10);
      }
    }
    uVar12 = uVar12 >> 1;
  }
  table->num_hints = uVar9;
  ppPVar5 = table->sort;
  for (lVar10 = 1; lVar10 < (int)uVar9; lVar10 = lVar10 + 1) {
    pPVar4 = ppPVar5[lVar10];
    lVar8 = lVar10;
    while ((0 < lVar8 && (pPVar4->org_pos <= ppPVar5[lVar8 + -1]->org_pos))) {
      ppPVar5[lVar8] = ppPVar5[lVar8 + -1];
      ppPVar5[lVar8 + -1] = pPVar4;
      lVar8 = lVar8 + -1;
    }
  }
  return;
}

Assistant:

static void
  psh_hint_table_activate_mask( PSH_Hint_Table  table,
                                PS_Mask         hint_mask )
  {
    FT_Int    mask = 0, val = 0;
    FT_Byte*  cursor = hint_mask->bytes;
    FT_UInt   idx, limit, count;


    limit = hint_mask->num_bits;
    count = 0;

    psh_hint_table_deactivate( table );

    for ( idx = 0; idx < limit; idx++ )
    {
      if ( mask == 0 )
      {
        val  = *cursor++;
        mask = 0x80;
      }

      if ( val & mask )
      {
        PSH_Hint  hint = &table->hints[idx];


        if ( !psh_hint_is_active( hint ) )
        {
          FT_UInt     count2;

#if 0
          PSH_Hint*  sort = table->sort;
          PSH_Hint   hint2;


          for ( count2 = count; count2 > 0; count2--, sort++ )
          {
            hint2 = sort[0];
            if ( psh_hint_overlap( hint, hint2 ) )
              FT_TRACE0(( "psh_hint_table_activate_mask:"
                          " found overlapping hints\n" ))
          }
#else
          count2 = 0;
#endif

          if ( count2 == 0 )
          {
            psh_hint_activate( hint );
            if ( count < table->max_hints )
              table->sort[count++] = hint;
            else
              FT_TRACE0(( "psh_hint_tableactivate_mask:"
                          " too many active hints\n" ));
          }
        }
      }

      mask >>= 1;
    }
    table->num_hints = count;

    /* now, sort the hints; they are guaranteed to not overlap */
    /* so we can compare their "org_pos" field directly        */
    {
      FT_Int     i1, i2;
      PSH_Hint   hint1, hint2;
      PSH_Hint*  sort = table->sort;


      /* a simple bubble sort will do, since in 99% of cases, the hints */
      /* will be already sorted -- and the sort will be linear          */
      for ( i1 = 1; i1 < (FT_Int)count; i1++ )
      {
        hint1 = sort[i1];
        for ( i2 = i1 - 1; i2 >= 0; i2-- )
        {
          hint2 = sort[i2];

          if ( hint2->org_pos < hint1->org_pos )
            break;

          sort[i2 + 1] = hint2;
          sort[i2]     = hint1;
        }
      }
    }
  }